

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

char * get_warned_of_monster(obj *otmp)

{
  unsigned_long uVar1;
  long lVar2;
  
  if ((otmp != (obj *)0x0) && (lVar2 = (long)otmp->oartifact, lVar2 != 0)) {
    if (((artilist[lVar2].spfx & 0x8000000) != 0) && (uVar1 = artilist[lVar2].mtype, uVar1 != 0)) {
      if (uVar1 == 0x2e) {
        return "trolls";
      }
      if (uVar1 == 0x24) {
        return "jabberwocks";
      }
      if (uVar1 == 0x29) {
        return "ogres";
      }
      if (uVar1 == 0x1e) {
        return "dragons";
      }
      return "something";
    }
  }
  return (char *)0x0;
}

Assistant:

const char *get_warned_of_monster(const struct obj *otmp)
{
	if (otmp && otmp->oartifact) {
	    const struct artifact *arti = get_artifact(otmp);
	    if (arti->spfx & SPFX_WARN_S && arti->mtype) {
		switch (arti->mtype) {
		case S_TROLL: return "trolls"; break;
		case S_DRAGON: return "dragons"; break;
		case S_OGRE: return "ogres"; break;
		case S_JABBERWOCK: return "jabberwocks"; break;
		default: return "something"; break;
		}
	    }
	}

	return NULL;
}